

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O3

SelectionSet * __thiscall
OpenMD::SelectionEvaluator::indexInstruction
          (SelectionSet *__return_storage_ptr__,SelectionEvaluator *this,any *value)

{
  char *pcVar1;
  pair<int,_int> range;
  int iVar2;
  type_info *ptVar3;
  pair<int,_int> *ppVar4;
  int *piVar5;
  SelectionSet local_78;
  SelectionSet local_58;
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> local_38;
  
  createSelectionSets(&local_78,this);
  ptVar3 = std::any::type(value);
  pcVar1 = *(char **)(ptVar3 + 8);
  if (pcVar1 == _put) {
LAB_0025e47d:
    piVar5 = (int *)std::__any_caster<int>(value);
    if (piVar5 == (int *)0x0) {
      std::__throw_bad_any_cast();
    }
    iVar2 = *piVar5;
    if ((iVar2 < 0) ||
       ((int)((*(int *)&((local_78.bitsets_.
                          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                          ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                        super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                        _M_finish.super__Bit_iterator_base._M_p -
              *(int *)&((local_78.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                       _M_start.super__Bit_iterator_base._M_p) * 8 +
             ((local_78.bitsets_.
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_start)->bitset_).
             super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
             super__Bit_iterator_base._M_offset) <= iVar2)) {
      invalidIndex(this,iVar2);
      goto LAB_0025e51b;
    }
    IndexFinder::find(&local_58,&this->indexFinder,iVar2);
LAB_0025e4bb:
    local_38.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         local_78.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_38.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
    .super__Vector_impl_data._M_finish =
         local_78.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_38.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
    .super__Vector_impl_data._M_start =
         local_78.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_78.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_58.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_78.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_58.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_78.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_58.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_58.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector(&local_38);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_58.bitsets_);
  }
  else {
    if (*pcVar1 != '*') {
      iVar2 = strcmp(pcVar1,_put);
      if (iVar2 == 0) goto LAB_0025e47d;
    }
    ptVar3 = std::any::type(value);
    pcVar1 = *(char **)(ptVar3 + 8);
    if (pcVar1 != "St4pairIiiE") {
      if (*pcVar1 == '*') goto LAB_0025e51b;
      iVar2 = strcmp(pcVar1,"St4pairIiiE");
      if (iVar2 != 0) goto LAB_0025e51b;
    }
    ppVar4 = (pair<int,_int> *)std::__any_caster<std::pair<int,int>>(value);
    if (ppVar4 == (pair<int,_int> *)0x0) {
      std::__throw_bad_any_cast();
    }
    range = *ppVar4;
    if (-1 < range.first) {
      if (range.second <
          (int)((*(int *)&((local_78.bitsets_.
                            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                            ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                          super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                *(int *)&((local_78.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p) * 8 +
               ((local_78.bitsets_.
                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                 _M_impl.super__Vector_impl_data._M_start)->bitset_).
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
               .super__Bit_iterator_base._M_offset)) {
        IndexFinder::find(&local_58,&this->indexFinder,range.first,range.second);
        goto LAB_0025e4bb;
      }
    }
    invalidIndexRange(this,range);
  }
LAB_0025e51b:
  SelectionSet::parallelReduce(__return_storage_ptr__,&local_78);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_78.bitsets_);
  return __return_storage_ptr__;
}

Assistant:

SelectionSet SelectionEvaluator::indexInstruction(const std::any& value) {
    SelectionSet bs = createSelectionSets();

    if (value.type() == typeid(int)) {
      int index = std::any_cast<int>(value);
      if (index < 0 ||
          index >= static_cast<int>(bs.bitsets_[STUNTDOUBLE].size())) {
        invalidIndex(index);
      } else {
        bs = indexFinder.find(index);
      }
    } else if (value.type() == typeid(std::pair<int, int>)) {
      std::pair<int, int> indexRange =
          std::any_cast<std::pair<int, int>>(value);
      assert(indexRange.first <= indexRange.second);
      if (indexRange.first < 0 ||
          indexRange.second >=
              static_cast<int>(bs.bitsets_[STUNTDOUBLE].size())) {
        invalidIndexRange(indexRange);
      } else {
        bs = indexFinder.find(indexRange.first, indexRange.second);
      }
    }

    return bs.parallelReduce();
  }